

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O0

void __thiscall CppJieba::MixSegment::~MixSegment(MixSegment *this)

{
  MixSegment *in_RDI;
  
  ~MixSegment(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~MixSegment()
            {
                dispose();
            }